

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

AggregateFunction *
duckdb::GetHistogramFunction<false>(AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType *in_RDX;
  
  switch(type->physical_type_) {
  case BOOL:
    GetMapTypeInternal<duckdb::HistogramFunctor,bool,duckdb::DefaultMapType<std::unordered_map<bool,unsigned_long,std::hash<bool>,std::equal_to<bool>,std::allocator<std::pair<bool_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case UINT8:
    GetMapTypeInternal<duckdb::HistogramFunctor,unsigned_char,duckdb::DefaultMapType<std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INT8:
    GetMapTypeInternal<duckdb::HistogramFunctor,signed_char,duckdb::DefaultMapType<std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case UINT16:
    GetMapTypeInternal<duckdb::HistogramFunctor,unsigned_short,duckdb::DefaultMapType<std::unordered_map<unsigned_short,unsigned_long,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INT16:
    GetMapTypeInternal<duckdb::HistogramFunctor,short,duckdb::DefaultMapType<std::unordered_map<short,unsigned_long,std::hash<short>,std::equal_to<short>,std::allocator<std::pair<short_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case UINT32:
    GetMapTypeInternal<duckdb::HistogramFunctor,unsigned_int,duckdb::DefaultMapType<std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INT32:
    GetMapTypeInternal<duckdb::HistogramFunctor,int,duckdb::DefaultMapType<std::unordered_map<int,unsigned_long,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case UINT64:
    GetMapTypeInternal<duckdb::HistogramFunctor,unsigned_long,duckdb::DefaultMapType<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INT64:
    GetMapTypeInternal<duckdb::HistogramFunctor,long,duckdb::DefaultMapType<std::unordered_map<long,unsigned_long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case FLOAT:
    GetMapTypeInternal<duckdb::HistogramFunctor,float,duckdb::DefaultMapType<std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case DOUBLE:
    GetMapTypeInternal<duckdb::HistogramFunctor,double,duckdb::DefaultMapType<std::unordered_map<double,unsigned_long,std::hash<double>,std::equal_to<double>,std::allocator<std::pair<double_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  default:
    if (type->physical_type_ == VARCHAR) {
      GetMapTypeInternal<duckdb::HistogramStringFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      return __return_storage_ptr__;
    }
  case UINT64|UINT8:
    GetMapTypeInternal<duckdb::HistogramGenericFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
  }
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetHistogramFunction(const LogicalType &type) {
	switch (type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::BOOL:
		return GetMapType<HistogramFunctor, bool, IS_ORDERED>(type);
	case PhysicalType::UINT8:
		return GetMapType<HistogramFunctor, uint8_t, IS_ORDERED>(type);
	case PhysicalType::UINT16:
		return GetMapType<HistogramFunctor, uint16_t, IS_ORDERED>(type);
	case PhysicalType::UINT32:
		return GetMapType<HistogramFunctor, uint32_t, IS_ORDERED>(type);
	case PhysicalType::UINT64:
		return GetMapType<HistogramFunctor, uint64_t, IS_ORDERED>(type);
	case PhysicalType::INT8:
		return GetMapType<HistogramFunctor, int8_t, IS_ORDERED>(type);
	case PhysicalType::INT16:
		return GetMapType<HistogramFunctor, int16_t, IS_ORDERED>(type);
	case PhysicalType::INT32:
		return GetMapType<HistogramFunctor, int32_t, IS_ORDERED>(type);
	case PhysicalType::INT64:
		return GetMapType<HistogramFunctor, int64_t, IS_ORDERED>(type);
	case PhysicalType::FLOAT:
		return GetMapType<HistogramFunctor, float, IS_ORDERED>(type);
	case PhysicalType::DOUBLE:
		return GetMapType<HistogramFunctor, double, IS_ORDERED>(type);
	case PhysicalType::VARCHAR:
		return GetStringMapType<HistogramStringFunctor, IS_ORDERED>(type);
#endif
	default:
		return GetStringMapType<HistogramGenericFunctor, IS_ORDERED>(type);
	}
}